

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SemanticAnalyser.cpp
# Opt level: O2

void __thiscall SemanticAnalyser::visit(SemanticAnalyser *this,VariableNode *node)

{
  optional<std::reference_wrapper<Symbol>_> oVar1;
  string name;
  string sStack_78;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_38;
  
  std::__cxx11::string::string((string *)&sStack_78,(string *)&node->name_);
  oVar1 = SymbolTable::lookup(&this->symbols_,&sStack_78,0);
  if (((undefined1  [16])
       oVar1.super__Optional_base<std::reference_wrapper<Symbol>,_true,_true>._M_payload.
       super__Optional_payload_base<std::reference_wrapper<Symbol>_> & (undefined1  [16])0x1) !=
      (undefined1  [16])0x0) {
    std::__cxx11::string::~string((string *)&sStack_78);
    return;
  }
  std::operator+(&local_58,"Usage of undeclared symbol ",&sStack_78);
  std::operator+(&local_38,&local_58,"!");
  reportError(&local_38,(Node *)node);
}

Assistant:

void SemanticAnalyser::visit(const VariableNode& node) 
{
  const auto name = node.getName();
  const auto symbol = symbols_.lookup(name);
  if(!symbol)
    reportError("Usage of undeclared symbol " + name + "!", node);
}